

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmt_helper.h
# Opt level: O0

void spdlog::details::fmt_helper::pad3<unsigned_int>(uint n,memory_buf_t *dest)

{
  char local_1b;
  char local_1a;
  char local_19;
  memory_buf_t *local_18;
  memory_buf_t *dest_local;
  uint n_local;
  
  local_18 = dest;
  dest_local._4_4_ = n;
  if (n < 1000) {
    local_19 = (char)((ulong)n / 100) + '0';
    fmt::v10::detail::buffer<char>::push_back(&dest->super_buffer<char>,&local_19);
    dest_local._4_4_ = dest_local._4_4_ % 100;
    local_1a = (char)(dest_local._4_4_ / 10) + '0';
    fmt::v10::detail::buffer<char>::push_back(&local_18->super_buffer<char>,&local_1a);
    local_1b = (char)((ulong)dest_local._4_4_ % 10) + '0';
    fmt::v10::detail::buffer<char>::push_back(&local_18->super_buffer<char>,&local_1b);
  }
  else {
    append_int<unsigned_int>(n,dest);
  }
  return;
}

Assistant:

inline void pad3(T n, memory_buf_t &dest) {
    static_assert(std::is_unsigned<T>::value, "pad3 must get unsigned T");
    if (n < 1000) {
        dest.push_back(static_cast<char>(n / 100 + '0'));
        n = n % 100;
        dest.push_back(static_cast<char>((n / 10) + '0'));
        dest.push_back(static_cast<char>((n % 10) + '0'));
    } else {
        append_int(n, dest);
    }
}